

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O1

vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *
vk::wsi::getPhysicalDeviceSurfacePresentModes
          (vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          VkSurfaceKHR surface)

{
  VkResult VVar1;
  vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_> *modes;
  deUint32 numModes;
  allocator_type local_2d;
  uint local_2c;
  
  local_2c = 0;
  VVar1 = (*vki->_vptr_InstanceInterface[0x11])(vki,physicalDevice,surface.m_internal,&local_2c,0);
  checkResult(VVar1,
              "vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,299);
  if ((ulong)local_2c == 0) {
    (__return_storage_ptr__->
    super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>::vector
              (__return_storage_ptr__,(ulong)local_2c,&local_2d);
    VVar1 = (*vki->_vptr_InstanceInterface[0x11])
                      (vki,physicalDevice,surface.m_internal,&local_2c,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkPresentModeKHR,_std::allocator<vk::VkPresentModeKHR>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, &modes[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x131);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkPresentModeKHR> getPhysicalDeviceSurfacePresentModes (const InstanceInterface&		vki,
																	VkPhysicalDevice				physicalDevice,
																	VkSurfaceKHR					surface)
{
	deUint32	numModes	= 0;

	VK_CHECK(vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, DE_NULL));

	if (numModes > 0)
	{
		std::vector<VkPresentModeKHR>	modes	(numModes);

		VK_CHECK(vki.getPhysicalDeviceSurfacePresentModesKHR(physicalDevice, surface, &numModes, &modes[0]));

		return modes;
	}
	else
		return std::vector<VkPresentModeKHR>();
}